

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O2

sds sdscatfmt(sds s,char *fmt,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  sds s_00;
  size_t sVar4;
  unsigned_long_long *puVar5;
  uint *puVar6;
  int *piVar7;
  longlong *plVar8;
  undefined8 in_RCX;
  ulong uVar9;
  undefined8 *puVar10;
  uint uVar11;
  undefined8 in_RDX;
  char cVar12;
  char *s_01;
  unsigned_long_long v;
  longlong value;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [21];
  unsigned_long_long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar2 = sdslen(s);
  sVar3 = strlen(fmt);
  s_00 = sdsMakeRoomFor(s,sVar2 + sVar3 * 2);
  uVar11 = 0x10;
  ap[0].overflow_arg_area = &stack0x00000008;
  do {
    cVar12 = *fmt;
    if (cVar12 == '\0') {
      s_00[sVar2] = '\0';
      return s_00;
    }
    sVar4 = sdsavail(s_00);
    if (sVar4 == 0) {
      s_00 = sdsMakeRoomFor(s_00,1);
      cVar12 = *fmt;
    }
    if (cVar12 == '%') {
      cVar12 = fmt[1];
      if (cVar12 != '\0') {
        fmt = fmt + 1;
        if (cVar12 == 'I') {
          uVar9 = (ulong)uVar11;
          if (uVar9 < 0x29) {
            uVar11 = uVar11 + 8;
            plVar8 = (longlong *)((long)local_e8 + uVar9);
          }
          else {
            plVar8 = (longlong *)ap[0].overflow_arg_area;
            ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
          }
          value = *plVar8;
LAB_001075a5:
          iVar1 = sdsll2str(buf,value);
LAB_001075ad:
          s_01 = buf;
          sVar3 = (size_t)iVar1;
        }
        else {
          if (cVar12 != 'S') {
            if (cVar12 == 'U') {
              uVar9 = (ulong)uVar11;
              if (uVar9 < 0x29) {
                uVar11 = uVar11 + 8;
                puVar5 = (unsigned_long_long *)((long)local_e8 + uVar9);
              }
              else {
                puVar5 = (unsigned_long_long *)ap[0].overflow_arg_area;
                ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
              }
              v = *puVar5;
            }
            else {
              if (cVar12 == 'i') {
                uVar9 = (ulong)uVar11;
                if (uVar9 < 0x29) {
                  uVar11 = uVar11 + 8;
                  piVar7 = (int *)((long)local_e8 + uVar9);
                }
                else {
                  piVar7 = (int *)ap[0].overflow_arg_area;
                  ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
                }
                value = (longlong)*piVar7;
                goto LAB_001075a5;
              }
              if (cVar12 != 'u') {
                if (cVar12 != 's') {
                  s_00[sVar2] = cVar12;
                  goto LAB_00107481;
                }
                goto LAB_0010745c;
              }
              uVar9 = (ulong)uVar11;
              if (uVar9 < 0x29) {
                uVar11 = uVar11 + 8;
                puVar6 = (uint *)((long)local_e8 + uVar9);
              }
              else {
                puVar6 = (uint *)ap[0].overflow_arg_area;
                ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
              }
              v = (unsigned_long_long)*puVar6;
            }
            iVar1 = sdsull2str(buf,v);
            goto LAB_001075ad;
          }
LAB_0010745c:
          uVar9 = (ulong)uVar11;
          if (uVar9 < 0x29) {
            uVar11 = uVar11 + 8;
            puVar10 = (undefined8 *)((long)local_e8 + uVar9);
          }
          else {
            puVar10 = (undefined8 *)ap[0].overflow_arg_area;
            ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
          }
          s_01 = (char *)*puVar10;
          if (cVar12 == 's') {
            sVar3 = strlen(s_01);
          }
          else {
            sVar3 = sdslen(s_01);
          }
        }
        sVar4 = sdsavail(s_00);
        if (sVar4 < sVar3) {
          s_00 = sdsMakeRoomFor(s_00,sVar3);
        }
        memcpy(s_00 + sVar2,s_01,sVar3);
        sdsinclen(s_00,sVar3);
        sVar2 = sVar2 + sVar3;
      }
    }
    else {
      s_00[sVar2] = cVar12;
LAB_00107481:
      sVar2 = sVar2 + 1;
      sdsinclen(s_00,1);
    }
    fmt = fmt + 1;
  } while( true );
}

Assistant:

sds sdscatfmt(sds s, char const *fmt, ...) {
    size_t initlen = sdslen(s);
    const char *f = fmt;
    long i;
    va_list ap;

    /* To avoid continuous reallocations, let's start with a buffer that
     * can hold at least two times the format string itself. It's not the
     * best heuristic but seems to work in practice. */
    s = sdsMakeRoomFor(s, initlen + strlen(fmt)*2);
    va_start(ap,fmt);
    f = fmt;    /* Next format specifier byte to process. */
    i = initlen; /* Position of the next byte to write to dest str. */
    while(*f) {
        char next, *str;
        size_t l;
        long long num;
        unsigned long long unum;

        /* Make sure there is always space for at least 1 char. */
        if (sdsavail(s)==0) {
            s = sdsMakeRoomFor(s,1);
        }

        switch(*f) {
        case '%':
            next = *(f+1);
            if (next == '\0') break;
            f++;
            switch(next) {
            case 's':
            case 'S':
                str = va_arg(ap,char*);
                l = (next == 's') ? strlen(str) : sdslen(str);
                if (sdsavail(s) < l) {
                    s = sdsMakeRoomFor(s,l);
                }
                memcpy(s+i,str,l);
                sdsinclen(s,l);
                i += l;
                break;
            case 'i':
            case 'I':
                if (next == 'i')
                    num = va_arg(ap,int);
                else
                    num = va_arg(ap,long long);
                {
                    char buf[SDS_LLSTR_SIZE];
                    l = sdsll2str(buf,num);
                    if (sdsavail(s) < l) {
                        s = sdsMakeRoomFor(s,l);
                    }
                    memcpy(s+i,buf,l);
                    sdsinclen(s,l);
                    i += l;
                }
                break;
            case 'u':
            case 'U':
                if (next == 'u')
                    unum = va_arg(ap,unsigned int);
                else
                    unum = va_arg(ap,unsigned long long);
                {
                    char buf[SDS_LLSTR_SIZE];
                    l = sdsull2str(buf,unum);
                    if (sdsavail(s) < l) {
                        s = sdsMakeRoomFor(s,l);
                    }
                    memcpy(s+i,buf,l);
                    sdsinclen(s,l);
                    i += l;
                }
                break;
            default: /* Handle %% and generally %<unknown>. */
                s[i++] = next;
                sdsinclen(s,1);
                break;
            }
            break;
        default:
            s[i++] = *f;
            sdsinclen(s,1);
            break;
        }
        f++;
    }
    va_end(ap);

    /* Add null-term */
    s[i] = '\0';
    return s;
}